

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int session_after_frame_sent1(nghttp2_session *session)

{
  char cVar1;
  nghttp2_frame *pnVar2;
  nghttp2_on_frame_send_callback p_Var3;
  int iVar4;
  int iVar5;
  nghttp2_stream *pnVar6;
  int32_t *recv_window_size_ptr;
  int32_t *consumed_size_ptr;
  int32_t iVar7;
  int32_t iVar8;
  
  pnVar2 = &((session->aob).item)->frame;
  cVar1 = *(char *)((long)pnVar2 + 0xc);
  if ((cVar1 == '\x05') || (cVar1 == '\x01')) {
    iVar4 = nghttp2_bufs_next_present(&(session->aob).framebufs);
    if (iVar4 != 0) {
      return 0;
    }
  }
  else if (cVar1 == '\0') {
    pnVar6 = (nghttp2_stream *)
             nghttp2_map_find(&session->streams,*(nghttp2_map_key_type *)((long)pnVar2 + 8));
    if (((pnVar6 == (nghttp2_stream *)0x0) || ((pnVar6->flags & 2) != 0)) ||
       (pnVar6->state == NGHTTP2_STREAM_IDLE)) {
      session->remote_window_size = session->remote_window_size - *(int *)pnVar2;
LAB_0010c068:
      p_Var3 = (session->callbacks).on_frame_send_callback;
      if (p_Var3 == (nghttp2_on_frame_send_callback)0x0) {
        return 0;
      }
      iVar4 = (*p_Var3)(session,pnVar2,session->user_data);
      if (iVar4 == 0) {
        return 0;
      }
      return -0x386;
    }
    session->remote_window_size = session->remote_window_size - *(int *)pnVar2;
    pnVar6->remote_window_size = pnVar6->remote_window_size - *(int *)pnVar2;
    if (*(char *)((long)pnVar2 + 0x79) == '\0') goto LAB_0010c068;
    session_detach_stream_item(session,pnVar6);
    p_Var3 = (session->callbacks).on_frame_send_callback;
    if ((p_Var3 != (nghttp2_on_frame_send_callback)0x0) &&
       (iVar4 = (*p_Var3)(session,pnVar2,session->user_data), iVar4 != 0)) {
      return -0x386;
    }
    if (((pnVar2->hd).flags & 1) == 0) {
      return 0;
    }
    nghttp2_stream_shutdown(pnVar6,NGHTTP2_SHUT_WR);
    if ((~pnVar6->shut_flags & 3) != 0) {
      return 0;
    }
    iVar4 = nghttp2_session_close_stream(session,pnVar6->stream_id,0);
    goto LAB_0010c1ee;
  }
  p_Var3 = (session->callbacks).on_frame_send_callback;
  if ((p_Var3 != (nghttp2_on_frame_send_callback)0x0) &&
     (iVar4 = (*p_Var3)(session,pnVar2,session->user_data), iVar4 != 0)) {
    return -0x386;
  }
  iVar4 = 0;
  switch(*(undefined1 *)((long)pnVar2 + 0xc)) {
  case 1:
    pnVar6 = (nghttp2_stream *)
             nghttp2_map_find(&session->streams,*(nghttp2_map_key_type *)((long)pnVar2 + 8));
    if (pnVar6 == (nghttp2_stream *)0x0) {
      return 0;
    }
    if ((pnVar6->flags & 2) != 0) {
      return 0;
    }
    if (pnVar6->state == NGHTTP2_STREAM_IDLE) {
      return 0;
    }
    switch(*(undefined4 *)((long)pnVar2 + 0x38)) {
    case 0:
      pnVar6->state = NGHTTP2_STREAM_OPENING;
      break;
    case 2:
      pnVar6->flags = pnVar6->flags & 0xfc;
      session->num_outgoing_streams = session->num_outgoing_streams + 1;
    case 1:
      pnVar6->state = NGHTTP2_STREAM_OPENED;
      break;
    case 3:
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                    ,0xbca,"int session_after_frame_sent1(nghttp2_session *)");
    }
    if (((pnVar2->hd).flags & 1) != 0) {
      nghttp2_stream_shutdown(pnVar6,NGHTTP2_SHUT_WR);
    }
    if (((~pnVar6->shut_flags & 3) == 0) &&
       (iVar4 = nghttp2_session_close_stream(session,pnVar6->stream_id,0), iVar4 < -900)) {
      return iVar4;
    }
    if (*(long *)((long)pnVar2 + 0x70) == 0) {
      return 0;
    }
    iVar4 = nghttp2_submit_data_shared
                      (session,'\x01',*(int32_t *)((long)pnVar2 + 8),
                       (nghttp2_data_provider_wrap *)((long)pnVar2 + 0x60));
    goto LAB_0010c1ee;
  case 2:
    if (session->server != '\0') {
      return 0;
    }
    if (session->pending_no_rfc7540_priorities == '\x01') {
      return 0;
    }
    pnVar6 = (nghttp2_stream *)
             nghttp2_map_find(&session->streams,*(nghttp2_map_key_type *)((long)pnVar2 + 8));
    if (pnVar6 == (nghttp2_stream *)0x0) {
      iVar7 = *(int32_t *)((long)pnVar2 + 8);
      if (iVar7 == 0) {
        return 0;
      }
      if ((session->server == '\0') == (bool)((byte)iVar7 & 1)) {
        iVar4 = session->last_sent_stream_id;
      }
      else {
        iVar4 = session->last_recv_stream_id;
      }
      if (iVar7 <= iVar4) {
        return 0;
      }
      pnVar6 = nghttp2_session_open_stream
                         (session,iVar7,'\0',(nghttp2_priority_spec *)((long)pnVar2 + 0x10),
                          NGHTTP2_STREAM_IDLE,(void *)0x0);
      if (pnVar6 == (nghttp2_stream *)0x0) {
        return -0x385;
      }
    }
    else {
      iVar4 = nghttp2_session_reprioritize_stream
                        (session,pnVar6,(nghttp2_priority_spec *)((long)pnVar2 + 0x10));
      if (iVar4 < -900) {
        return iVar4;
      }
    }
    iVar5 = nghttp2_session_adjust_idle_stream(session);
    break;
  case 3:
    iVar5 = nghttp2_session_close_stream
                      (session,*(int32_t *)((long)pnVar2 + 8),*(uint32_t *)((long)pnVar2 + 0x10));
    break;
  default:
    goto switchD_0010c0f1_caseD_4;
  case 7:
    if ((*(byte *)((long)pnVar2 + 0x60) & 2) != 0) {
      return 0;
    }
    session->goaway_flags = *(byte *)((long)pnVar2 + 0x60) * '\x02' & 2 | session->goaway_flags | 4;
    iVar4 = session_close_stream_on_goaway(session,*(int32_t *)((long)pnVar2 + 0x10),1);
LAB_0010c1ee:
    if (iVar4 < -900) {
      return iVar4;
    }
    return 0;
  case 8:
    if (*(int32_t *)((long)pnVar2 + 8) == 0) {
      session->window_update_queued = '\0';
      if ((session->opt_flags & 1) != 0) {
        consumed_size_ptr = &session->consumed_size;
        recv_window_size_ptr = &session->recv_window_size;
        iVar8 = session->local_window_size;
        iVar7 = 0;
        goto LAB_0010c34a;
      }
      iVar5 = nghttp2_session_update_recv_connection_window_size(session,0);
    }
    else {
      pnVar6 = nghttp2_session_get_stream(session,*(int32_t *)((long)pnVar2 + 8));
      if (pnVar6 == (nghttp2_stream *)0x0) {
        return 0;
      }
      pnVar6->window_update_queued = '\0';
      if ((pnVar6->shut_flags & 1) != 0) {
        return 0;
      }
      if ((session->opt_flags & 1) == 0) {
        iVar5 = nghttp2_session_update_recv_stream_window_size(session,pnVar6,0,1);
      }
      else {
        consumed_size_ptr = &pnVar6->consumed_size;
        recv_window_size_ptr = &pnVar6->recv_window_size;
        iVar7 = pnVar6->stream_id;
        iVar8 = pnVar6->local_window_size;
LAB_0010c34a:
        iVar5 = session_update_consumed_size
                          (session,consumed_size_ptr,recv_window_size_ptr,'\0',iVar7,0,iVar8);
      }
    }
  }
  iVar4 = 0;
  if (iVar5 < -900) {
    iVar4 = iVar5;
  }
switchD_0010c0f1_caseD_4:
  return iVar4;
}

Assistant:

static int session_after_frame_sent1(nghttp2_session *session) {
  int rv;
  nghttp2_active_outbound_item *aob = &session->aob;
  nghttp2_outbound_item *item = aob->item;
  nghttp2_bufs *framebufs = &aob->framebufs;
  nghttp2_frame *frame;
  nghttp2_stream *stream;

  frame = &item->frame;

  if (frame->hd.type == NGHTTP2_DATA) {
    nghttp2_data_aux_data *aux_data;

    aux_data = &item->aux_data.data;

    stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
    /* We update flow control window after a frame was completely
       sent. This is possible because we choose payload length not to
       exceed the window */
    session->remote_window_size -= (int32_t)frame->hd.length;
    if (stream) {
      stream->remote_window_size -= (int32_t)frame->hd.length;
    }

    if (stream && aux_data->eof) {
      session_detach_stream_item(session, stream);

      /* Call on_frame_send_callback after
         nghttp2_stream_detach_item(), so that application can issue
         nghttp2_submit_data2() in the callback. */
      if (session->callbacks.on_frame_send_callback) {
        rv = session_call_on_frame_send(session, frame);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
      }

      if (frame->hd.flags & NGHTTP2_FLAG_END_STREAM) {
        int stream_closed;

        stream_closed =
          (stream->shut_flags & NGHTTP2_SHUT_RDWR) == NGHTTP2_SHUT_RDWR;

        nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_WR);

        rv = nghttp2_session_close_stream_if_shut_rdwr(session, stream);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        /* stream may be NULL if it was closed */
        if (stream_closed) {
          stream = NULL;
        }
      }
      return 0;
    }

    if (session->callbacks.on_frame_send_callback) {
      rv = session_call_on_frame_send(session, frame);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
    }

    return 0;
  }

  /* non-DATA frame */

  if (frame->hd.type == NGHTTP2_HEADERS ||
      frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    if (nghttp2_bufs_next_present(framebufs)) {
      DEBUGF("send: CONTINUATION exists, just return\n");
      return 0;
    }
  }
  rv = session_call_on_frame_send(session, frame);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }
  switch (frame->hd.type) {
  case NGHTTP2_HEADERS: {
    nghttp2_headers_aux_data *aux_data;

    stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
    if (!stream) {
      return 0;
    }

    switch (frame->headers.cat) {
    case NGHTTP2_HCAT_REQUEST: {
      stream->state = NGHTTP2_STREAM_OPENING;
      if (frame->hd.flags & NGHTTP2_FLAG_END_STREAM) {
        nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_WR);
      }
      rv = nghttp2_session_close_stream_if_shut_rdwr(session, stream);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
      /* We assume aux_data is a pointer to nghttp2_headers_aux_data */
      aux_data = &item->aux_data.headers;
      if (aux_data->dpw.data_prd.read_callback) {
        /* nghttp2_submit_data_shared() makes a copy of
           aux_data->dpw */
        rv = nghttp2_submit_data_shared(session, NGHTTP2_FLAG_END_STREAM,
                                        frame->hd.stream_id, &aux_data->dpw);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        /* TODO nghttp2_submit_data_shared() may fail if stream has
           already DATA frame item.  We might have to handle it
           here. */
      }
      return 0;
    }
    case NGHTTP2_HCAT_PUSH_RESPONSE:
      stream->flags = (uint8_t)(stream->flags & ~NGHTTP2_STREAM_FLAG_PUSH);
      ++session->num_outgoing_streams;
    /* Fall through */
    case NGHTTP2_HCAT_RESPONSE:
      stream->state = NGHTTP2_STREAM_OPENED;
    /* Fall through */
    case NGHTTP2_HCAT_HEADERS:
      if (frame->hd.flags & NGHTTP2_FLAG_END_STREAM) {
        nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_WR);
      }
      rv = nghttp2_session_close_stream_if_shut_rdwr(session, stream);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
      /* We assume aux_data is a pointer to nghttp2_headers_aux_data */
      aux_data = &item->aux_data.headers;
      if (aux_data->dpw.data_prd.read_callback) {
        rv = nghttp2_submit_data_shared(session, NGHTTP2_FLAG_END_STREAM,
                                        frame->hd.stream_id, &aux_data->dpw);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        /* TODO nghttp2_submit_data_shared() may fail if stream has
           already DATA frame item.  We might have to handle it
           here. */
      }
      return 0;
    default:
      /* Unreachable */
      assert(0);
      return 0;
    }
  }
  case NGHTTP2_PRIORITY:
    if (session->server || session->pending_no_rfc7540_priorities == 1) {
      return 0;
    }

    stream = nghttp2_session_get_stream_raw(session, frame->hd.stream_id);

    if (!stream) {
      if (!session_detect_idle_stream(session, frame->hd.stream_id)) {
        return 0;
      }

      stream = nghttp2_session_open_stream(
        session, frame->hd.stream_id, NGHTTP2_FLAG_NONE,
        &frame->priority.pri_spec, NGHTTP2_STREAM_IDLE, NULL);
      if (!stream) {
        return NGHTTP2_ERR_NOMEM;
      }
    } else {
      rv = nghttp2_session_reprioritize_stream(session, stream,
                                               &frame->priority.pri_spec);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
    }

    rv = nghttp2_session_adjust_idle_stream(session);

    if (nghttp2_is_fatal(rv)) {
      return rv;
    }

    return 0;
  case NGHTTP2_RST_STREAM:
    rv = nghttp2_session_close_stream(session, frame->hd.stream_id,
                                      frame->rst_stream.error_code);
    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
    return 0;
  case NGHTTP2_GOAWAY: {
    nghttp2_goaway_aux_data *aux_data;

    aux_data = &item->aux_data.goaway;

    if ((aux_data->flags & NGHTTP2_GOAWAY_AUX_SHUTDOWN_NOTICE) == 0) {
      if (aux_data->flags & NGHTTP2_GOAWAY_AUX_TERM_ON_SEND) {
        session->goaway_flags |= NGHTTP2_GOAWAY_TERM_SENT;
      }

      session->goaway_flags |= NGHTTP2_GOAWAY_SENT;

      rv = session_close_stream_on_goaway(session, frame->goaway.last_stream_id,
                                          1);

      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
    }

    return 0;
  }
  case NGHTTP2_WINDOW_UPDATE:
    if (frame->hd.stream_id == 0) {
      session->window_update_queued = 0;
      if (session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE) {
        rv = session_update_connection_consumed_size(session, 0);
      } else {
        rv = nghttp2_session_update_recv_connection_window_size(session, 0);
      }

      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      return 0;
    }

    stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
    if (!stream) {
      return 0;
    }

    stream->window_update_queued = 0;

    /* We don't have to send WINDOW_UPDATE if END_STREAM from peer
       is seen. */
    if (stream->shut_flags & NGHTTP2_SHUT_RD) {
      return 0;
    }

    if (session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE) {
      rv = session_update_stream_consumed_size(session, stream, 0);
    } else {
      rv =
        nghttp2_session_update_recv_stream_window_size(session, stream, 0, 1);
    }

    if (nghttp2_is_fatal(rv)) {
      return rv;
    }

    return 0;
  default:
    return 0;
  }
}